

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes,string *targetCompilePdb,string *targetPdb,string *outputConfig,
          WithScanning withScanning)

{
  cmGeneratorTarget *pcVar1;
  string_view source;
  bool bVar2;
  bool bVar3;
  int iVar4;
  cmGlobalNinjaGenerator *pcVar5;
  cmake *this_00;
  string *psVar6;
  ulong uVar7;
  cmMakefile *pcVar8;
  const_iterator pvVar9;
  cmLocalNinjaGenerator *pcVar10;
  pointer this_01;
  container_type *cmdLines;
  string local_5c0;
  undefined1 local_5a0 [8];
  string cmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  cmList compileCmds;
  string *compileCmd;
  string cmdVar;
  allocator<char> local_4f1;
  string local_4f0;
  string *local_4d0;
  string *wholeFlag;
  string local_4c0;
  string *local_4a0;
  string *flag;
  string defName;
  string propName;
  string_view mode;
  const_iterator __end2;
  const_iterator __begin2;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL> *__range2;
  bool useNormalCompileMode;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  string *local_398;
  string *rdcFlag;
  string local_388;
  undefined1 local_368 [8];
  string cudaCompileMode;
  string local_340;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  string local_2d8;
  undefined1 local_2b8 [8];
  string modmapFlags;
  string modmapFormat;
  string modmapFormatVar;
  string fullFlags;
  string local_228;
  string local_208;
  undefined1 local_1e8 [8];
  string escapedSourceFileName;
  RuleVariables compileObjectVars;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *objectFileDir_local;
  string *objectFileName_local;
  string *objectDir_local;
  string *sourceFileName_local;
  string *language_local;
  cmNinjaTargetGenerator *this_local;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_38 = objectFileDir;
  objectFileDir_local = objectFileName;
  objectFileName_local = objectDir;
  objectDir_local = sourceFileName;
  sourceFileName_local = language;
  language_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"EXPORT_COMPILE_COMMANDS",&local_59);
  bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&escapedSourceFileName.field_2 + 8));
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)local_1e8,(string *)objectDir_local);
    bVar2 = cmsys::SystemTools::FileIsFullPath(objectDir_local);
    if (!bVar2) {
      pcVar5 = GetGlobalGenerator(this);
      this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)pcVar5);
      psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
      cmsys::SystemTools::CollapseFullPath(&local_208,(string *)local_1e8,psVar6);
      std::__cxx11::string::operator=((string *)local_1e8,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
    }
    pcVar10 = this->LocalGenerator;
    source = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1e8);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_228,(cmOutputConverter *)pcVar10,source,SHELL,false);
    std::__cxx11::string::operator=((string *)local_1e8,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::string
              ((string *)(modmapFormatVar.field_2._M_local_buf + 8),(string *)flags);
    if (withScanning == Yes) {
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[19]>
                ((string *)((long)&modmapFormat.field_2 + 8),(char (*) [7])0x11240fa,
                 sourceFileName_local,(char (*) [19])"_MODULE_MAP_FORMAT");
      psVar6 = cmMakefile::GetSafeDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,
                          (string *)((long)&modmapFormat.field_2 + 8));
      std::__cxx11::string::string
                ((string *)(modmapFlags.field_2._M_local_buf + 8),(string *)psVar6);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar8 = GetMakefile(this);
        cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[17]>
                  (&local_2d8,(char (*) [7])0x11240fa,sourceFileName_local,
                   (char (*) [17])"_MODULE_MAP_FLAG");
        psVar6 = cmMakefile::GetRequiredDefinition(pcVar8,&local_2d8);
        std::__cxx11::string::string((string *)local_2b8,(string *)psVar6);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"<MODULE_MAP_FILE>",&local_2f9);
        cmStrCat<std::__cxx11::string_const&,char_const(&)[8]>
                  (&local_320,objectFileDir_local,(char (*) [8])".modmap");
        cmsys::SystemTools::ReplaceString((string *)local_2b8,&local_2f8,&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator(&local_2f9);
        cudaCompileMode.field_2._M_local_buf[0xf] = ' ';
        cmStrCat<char,std::__cxx11::string&>
                  (&local_340,cudaCompileMode.field_2._M_local_buf + 0xf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
        std::__cxx11::string::operator+=
                  ((string *)(modmapFormatVar.field_2._M_local_buf + 8),(string *)&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)local_2b8);
      }
      std::__cxx11::string::~string((string *)(modmapFlags.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(modmapFormat.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)local_368);
    bVar2 = std::operator==(sourceFileName_local,"CUDA");
    if (bVar2) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,"CUDA_SEPARABLE_COMPILATION",
                 (allocator<char> *)((long)&rdcFlag + 7));
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::allocator<char>::~allocator((allocator<char> *)((long)&rdcFlag + 7));
      if (bVar2) {
        pcVar8 = (this->super_cmCommonTargetGenerator).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b8,"_CMAKE_CUDA_RDC_FLAG",&local_3b9);
        psVar6 = cmMakefile::GetRequiredDefinition(pcVar8,&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::allocator<char>::~allocator(&local_3b9);
        local_398 = psVar6;
        cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&,char_const(&)[2]>
                  (&local_3e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                   psVar6,(char (*) [2])0x110c0bc);
        std::__cxx11::string::operator=((string *)local_368,(string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
      }
      if (ExportObjectCompileCommand(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
          ::compileModes == '\0') {
        iVar4 = __cxa_guard_acquire(&ExportObjectCompileCommand(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
                                     ::compileModes);
        if (iVar4 != 0) {
          ExportObjectCompileCommand::compileModes._M_elems[0] =
               (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("PTX",3);
          ExportObjectCompileCommand::compileModes._M_elems[1] =
               (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CUBIN",5);
          ExportObjectCompileCommand::compileModes._M_elems[2] =
               (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("FATBIN",6);
          ExportObjectCompileCommand::compileModes._M_elems[3] =
               (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("OPTIX",5);
          __cxa_guard_release(&ExportObjectCompileCommand(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
                               ::compileModes);
        }
      }
      bVar2 = true;
      __end2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL>::begin
                         (&ExportObjectCompileCommand::compileModes);
      pvVar9 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL>::end
                         (&ExportObjectCompileCommand::compileModes);
      for (; __end2 != pvVar9; __end2 = __end2 + 1) {
        propName.field_2._8_8_ = __end2->_M_len;
        cmStrCat<char_const(&)[6],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[13]>
                  ((string *)((long)&defName.field_2 + 8),(char (*) [6])0x1148f97,
                   (basic_string_view<char,_std::char_traits<char>_> *)((long)&propName.field_2 + 8)
                   ,(char (*) [13])0x1128526);
        cmStrCat<char_const(&)[13],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>
                  ((string *)&flag,(char (*) [13])"_CMAKE_CUDA_",
                   (basic_string_view<char,_std::char_traits<char>_> *)((long)&propName.field_2 + 8)
                   ,(char (*) [6])0x1148f7a);
        bVar3 = cmGeneratorTarget::GetPropertyAsBool
                          ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                           (string *)((long)&defName.field_2 + 8));
        if (bVar3) {
          local_4a0 = cmMakefile::GetRequiredDefinition
                                ((this->super_cmCommonTargetGenerator).Makefile,(string *)&flag);
          cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>
                    (&local_4c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                     local_4a0);
          std::__cxx11::string::operator=((string *)local_368,(string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_4c0);
          bVar2 = false;
          wholeFlag._4_4_ = 2;
        }
        else {
          wholeFlag._4_4_ = 0;
        }
        std::__cxx11::string::~string((string *)&flag);
        std::__cxx11::string::~string((string *)(defName.field_2._M_local_buf + 8));
        if (wholeFlag._4_4_ != 0) break;
      }
      if (bVar2) {
        pcVar8 = (this->super_cmCommonTargetGenerator).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f0,"_CMAKE_CUDA_WHOLE_FLAG",&local_4f1);
        psVar6 = cmMakefile::GetRequiredDefinition(pcVar8,&local_4f0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator(&local_4f1);
        local_4d0 = psVar6;
        cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>
                  ((string *)((long)&cmdVar.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                   psVar6);
        std::__cxx11::string::operator=
                  ((string *)local_368,(string *)(cmdVar.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(cmdVar.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::c_str();
    }
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16]>
              ((string *)&compileCmd,(char (*) [7])0x11240fa,sourceFileName_local,
               (char (*) [16])0x1149354);
    psVar6 = cmMakefile::GetRequiredDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,(string *)&compileCmd);
    cmList::cmList((cmList *)&rulePlaceholderExpander,psVar6,Yes,No);
    pcVar10 = GetLocalGenerator(this);
    (*(pcVar10->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[6])(&__range1);
    __end1 = cmList::begin_abi_cxx11_((cmList *)&rulePlaceholderExpander);
    i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        cmList::end_abi_cxx11_((cmList *)&rulePlaceholderExpander);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&i);
      if (!bVar2) break;
      cmdLine.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      this_01 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&__range1);
      pcVar10 = GetLocalGenerator(this);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_01,(cmOutputConverter *)pcVar10,(string *)cmdLine.field_2._8_8_,
                 (RuleVariables *)((long)&escapedSourceFileName.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pcVar10 = GetLocalGenerator(this);
    cmdLines = cmList::operator_cast_to_vector_((cmList *)&rulePlaceholderExpander);
    std::__cxx11::string::string((string *)&local_5c0);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_5a0,pcVar10,cmdLines,outputConfig,outputConfig,&local_5c0,
               (cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&local_5c0);
    pcVar5 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddCXXCompileCommand
              (pcVar5,(string *)local_5a0,objectDir_local,objectFileDir_local);
    std::__cxx11::string::~string((string *)local_5a0);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&__range1);
    cmList::~cmList((cmList *)&rulePlaceholderExpander);
    std::__cxx11::string::~string((string *)&compileCmd);
    std::__cxx11::string::~string((string *)local_368);
    std::__cxx11::string::~string((string *)(modmapFormatVar.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_1e8);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes,
  std::string const& targetCompilePdb, std::string const& targetPdb,
  std::string const& outputConfig, WithScanning withScanning)
{
  if (!this->GeneratorTarget->GetPropertyAsBool("EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    escapedSourceFileName =
      cmSystemTools::CollapseFullPath(escapedSourceFileName,
                                      this->GetGlobalGenerator()
                                        ->GetCMakeInstance()
                                        ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  std::string fullFlags = flags;
  if (withScanning == WithScanning::Yes) {
    std::string const modmapFormatVar =
      cmStrCat("CMAKE_", language, "_MODULE_MAP_FORMAT");
    std::string const modmapFormat =
      this->Makefile->GetSafeDefinition(modmapFormatVar);
    if (!modmapFormat.empty()) {
      std::string modmapFlags = this->GetMakefile()->GetRequiredDefinition(
        cmStrCat("CMAKE_", language, "_MODULE_MAP_FLAG"));
      // XXX(modmap): If changing this path construction, change
      // `cmGlobalNinjaGenerator::WriteDyndep` and
      // `cmNinjaTargetGenerator::WriteObjectBuildStatement` to expect the
      // corresponding file path.
      cmSystemTools::ReplaceString(modmapFlags, "<MODULE_MAP_FILE>",
                                   cmStrCat(objectFileName, ".modmap"));
      fullFlags += cmStrCat(' ', modmapFlags);
    }
  }

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = fullFlags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();
  compileObjectVars.TargetCompilePDB = targetCompilePdb.c_str();
  compileObjectVars.TargetPDB = targetPdb.c_str();

  // Rule for compiling object file.
  std::string cudaCompileMode;
  if (language == "CUDA") {
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      const std::string& rdcFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_RDC_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, rdcFlag, " ");
    }
    static std::array<cm::string_view, 4> const compileModes{
      { "PTX"_s, "CUBIN"_s, "FATBIN"_s, "OPTIX"_s }
    };
    bool useNormalCompileMode = true;
    for (cm::string_view mode : compileModes) {
      auto propName = cmStrCat("CUDA_", mode, "_COMPILATION");
      auto defName = cmStrCat("_CMAKE_CUDA_", mode, "_FLAG");
      if (this->GeneratorTarget->GetPropertyAsBool(propName)) {
        const std::string& flag =
          this->Makefile->GetRequiredDefinition(defName);
        cudaCompileMode = cmStrCat(cudaCompileMode, flag);
        useNormalCompileMode = false;
        break;
      }
    }
    if (useNormalCompileMode) {
      const std::string& wholeFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_WHOLE_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, wholeFlag);
    }
    compileObjectVars.CudaCompileMode = cudaCompileMode.c_str();
  }

  const std::string cmdVar = cmStrCat("CMAKE_", language, "_COMPILE_OBJECT");
  const std::string& compileCmd =
    this->Makefile->GetRequiredDefinition(cmdVar);
  cmList compileCmds(compileCmd);

  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();

  for (auto& i : compileCmds) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 compileObjectVars);
  }

  std::string cmdLine = this->GetLocalGenerator()->BuildCommandLine(
    compileCmds, outputConfig, outputConfig);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName,
                                                   objectFileName);
}